

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecimalDatatypeValidator.cpp
# Opt level: O0

XMLCh * __thiscall
xercesc_4_0::DecimalDatatypeValidator::getCanonicalRepresentation
          (DecimalDatatypeValidator *this,XMLCh *rawData,MemoryManager *memMgr,bool toValidate)

{
  CanRepGroup CVar1;
  MemoryManager *local_60;
  CanRepGroup dvType;
  DecimalDatatypeValidator *temp;
  MemoryManager *toUse;
  bool toValidate_local;
  MemoryManager *memMgr_local;
  XMLCh *rawData_local;
  DecimalDatatypeValidator *this_local;
  
  local_60 = memMgr;
  if (memMgr == (MemoryManager *)0x0) {
    local_60 = (this->super_AbstractNumericValidator).super_AbstractNumericFacetValidator.
               super_DatatypeValidator.fMemoryManager;
  }
  if (toValidate) {
    (*(this->super_AbstractNumericValidator).super_AbstractNumericFacetValidator.
      super_DatatypeValidator.super_XSerializable._vptr_XSerializable[0x11])
              (this,rawData,0,0,local_60);
  }
  CVar1 = DatatypeValidatorFactory::getCanRepGroup((DatatypeValidator *)this);
  if (((CVar1 == Decimal_Derived_signed) || (CVar1 == Decimal_Derived_unsigned)) ||
     (CVar1 == Decimal_Derived_npi)) {
    this_local = (DecimalDatatypeValidator *)
                 XMLBigInteger::getCanonicalRepresentation
                           (rawData,local_60,CVar1 == Decimal_Derived_npi);
  }
  else if (CVar1 == Decimal) {
    this_local = (DecimalDatatypeValidator *)
                 XMLBigDecimal::getCanonicalRepresentation(rawData,local_60);
  }
  else {
    this_local = (DecimalDatatypeValidator *)XMLString::replicate(rawData,local_60);
  }
  return (XMLCh *)this_local;
}

Assistant:

const XMLCh* DecimalDatatypeValidator::getCanonicalRepresentation(const XMLCh*         const rawData
                                                                 ,      MemoryManager* const memMgr
                                                                 ,      bool                 toValidate) const
{
    MemoryManager* toUse = memMgr? memMgr : fMemoryManager;
    DecimalDatatypeValidator* temp = (DecimalDatatypeValidator*) this;

    if (toValidate)
    {
        try
        {
            temp->checkContent(rawData, 0, false, toUse);
        }
        catch (...)
        {
            return 0;
        }
    }

    // XMLBigInteger::getCanonicalRepresentation and
    // XMLBigDecimal::getCanonicalRepresentation will handle exceptional cases
    XMLCanRepGroup::CanRepGroup dvType = DatatypeValidatorFactory::getCanRepGroup(temp);

    if ((dvType == XMLCanRepGroup::Decimal_Derived_signed)   ||
        (dvType == XMLCanRepGroup::Decimal_Derived_unsigned) ||
        (dvType == XMLCanRepGroup::Decimal_Derived_npi)        )
    {
        return XMLBigInteger::getCanonicalRepresentation(rawData, toUse, dvType == XMLCanRepGroup::Decimal_Derived_npi);
    }
    else if (dvType == XMLCanRepGroup::Decimal)
    {
        return XMLBigDecimal::getCanonicalRepresentation(rawData, toUse);
    }
    else //in case?
    {
        return XMLString::replicate(rawData, toUse);
    }

}